

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::~SmallHeapBlockT
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  HeapInfo *pHVar1;
  code *pcVar2;
  bool bVar3;
  HeapBlockType HVar4;
  IdleDecommitPageAllocator *this_00;
  undefined4 *puVar5;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  (this->super_HeapBlock)._vptr_HeapBlock = (_func_int **)&PTR_WBSetBit_01ddee68;
  if (((this->super_HeapBlock).segment != (Segment *)0x0) ||
     ((this->super_HeapBlock).address != (char *)0x0)) {
    bVar3 = HeapBlock::IsLeafBlock(&this->super_HeapBlock);
    if (!bVar3) {
      this_00 = GetPageAllocator(this);
      bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::IsClosed(&this_00->super_PageAllocator);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x92,
                           "((this->segment == nullptr && this->address == nullptr) || (this->IsLeafBlock()) || this->GetPageAllocator()->IsClosed())"
                           ,
                           "(this->segment == nullptr && this->address == nullptr) || (this->IsLeafBlock()) || this->GetPageAllocator()->IsClosed()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  pHVar1 = this->heapBucket->heapInfo;
  HVar4 = HeapBlock::GetHeapBlockType(&this->super_HeapBlock);
  pHVar1->heapBlockCount[HVar4] = pHVar1->heapBlockCount[HVar4] - 1;
  this->heapBucket->heapBlockCount = this->heapBucket->heapBlockCount - 1;
  return;
}

Assistant:

SmallHeapBlockT<TBlockAttributes>::~SmallHeapBlockT()
{
    Assert((this->segment == nullptr && this->address == nullptr) ||
        (this->IsLeafBlock()) ||
        this->GetPageAllocator()->IsClosed());

#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    heapBucket->heapInfo->heapBlockCount[this->GetHeapBlockType()]--;
#endif

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    heapBucket->heapBlockCount--;
#endif
}